

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O1

bool is_binary_string(string *v,string *str)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  string *__range2;
  size_type sVar4;
  byte bVar5;
  bool bVar6;
  long *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::string::substr((ulong)local_48,(ulong)v);
  iVar3 = std::__cxx11::string::compare((char *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (iVar3 == 0) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)v);
    std::__cxx11::string::operator=((string *)str,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    bVar6 = str->_M_string_length == 0;
    if (!bVar6) {
      sVar4 = 0;
      bVar2 = false;
      do {
        cVar1 = (str->_M_dataplus)._M_p[sVar4];
        bVar5 = cVar1 - 0x30;
        if (9 < bVar5) {
          if (cVar1 < 'a') {
            bVar5 = cVar1 - 0x37;
            if (cVar1 < 'A') {
              bVar5 = 0x10;
            }
          }
          else {
            bVar5 = cVar1 + 0xa9;
          }
        }
        bVar2 = (bool)(bVar2 ^ (char)bVar5 < '\x10');
        if ('\x0f' < (char)bVar5) break;
        sVar4 = sVar4 + 1;
        bVar6 = str->_M_string_length == sVar4;
      } while (!bVar6);
      bVar6 = (bool)(bVar6 & !bVar2);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

static bool
is_binary_string(std::string const& v, std::string& str)
{
    if (v.substr(0, 2) == "b:") {
        str = v.substr(2);
        int count = 0;
        for (char c: str) {
            if (!util::is_hex_digit(c)) {
                return false;
            }
            ++count;
        }
        return (count % 2 == 0);
    }
    return false;
}